

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O2

void __thiscall
perfetto::protos::gen::ReadBuffersResponse_Slice::ReadBuffersResponse_Slice
          (ReadBuffersResponse_Slice *this,ReadBuffersResponse_Slice *param_1)

{
  (this->super_CppMessageObj)._vptr_CppMessageObj =
       (_func_int **)&PTR__ReadBuffersResponse_Slice_004090b8;
  ::std::__cxx11::string::string((string *)&this->data_,(string *)&param_1->data_);
  this->last_slice_for_packet_ = param_1->last_slice_for_packet_;
  ::std::__cxx11::string::string
            ((string *)&this->unknown_fields_,(string *)&param_1->unknown_fields_);
  (this->_has_field_).super__Base_bitset<1UL>._M_w =
       (param_1->_has_field_).super__Base_bitset<1UL>._M_w;
  return;
}

Assistant:

ReadBuffersResponse_Slice::ReadBuffersResponse_Slice(const ReadBuffersResponse_Slice&) = default;